

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxconvenience.cpp
# Opt level: O2

QList<int> *
qglx_buildSpec(QList<int> *__return_storage_ptr__,QSurfaceFormat *format,int drawableBit,int flags)

{
  bool bVar1;
  int iVar2;
  SwapBehavior SVar3;
  QColorSpace *this;
  parameter_type pVar4;
  long in_FS_OFFSET;
  QColorSpace local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<int>::append(__return_storage_ptr__,3);
  QList<int>::append(__return_storage_ptr__,0);
  QList<int>::append(__return_storage_ptr__,0x8011);
  pVar4 = 1;
  QList<int>::append(__return_storage_ptr__,1);
  QList<int>::append(__return_storage_ptr__,8);
  iVar2 = QSurfaceFormat::redBufferSize(format);
  if (iVar2 < 2) {
    iVar2 = pVar4;
  }
  QList<int>::append(__return_storage_ptr__,iVar2);
  QList<int>::append(__return_storage_ptr__,9);
  iVar2 = QSurfaceFormat::greenBufferSize(format);
  if (iVar2 < 2) {
    iVar2 = pVar4;
  }
  QList<int>::append(__return_storage_ptr__,iVar2);
  QList<int>::append(__return_storage_ptr__,10);
  iVar2 = QSurfaceFormat::blueBufferSize(format);
  if (1 < iVar2) {
    pVar4 = iVar2;
  }
  QList<int>::append(__return_storage_ptr__,pVar4);
  QList<int>::append(__return_storage_ptr__,0xb);
  iVar2 = QSurfaceFormat::alphaBufferSize(format);
  pVar4 = 0;
  if (0 < iVar2) {
    pVar4 = iVar2;
  }
  QList<int>::append(__return_storage_ptr__,pVar4);
  SVar3 = QSurfaceFormat::swapBehavior(format);
  if (SVar3 != SingleBuffer) {
    QList<int>::append(__return_storage_ptr__,5);
    QList<int>::append(__return_storage_ptr__,1);
  }
  bVar1 = QSurfaceFormat::stereo(format);
  if (bVar1) {
    QList<int>::append(__return_storage_ptr__,6);
    QList<int>::append(__return_storage_ptr__,1);
  }
  iVar2 = QSurfaceFormat::depthBufferSize(format);
  if (iVar2 != -1) {
    QList<int>::append(__return_storage_ptr__,0xc);
    iVar2 = QSurfaceFormat::depthBufferSize(format);
    QList<int>::append(__return_storage_ptr__,iVar2);
  }
  iVar2 = QSurfaceFormat::stencilBufferSize(format);
  if (iVar2 != -1) {
    QList<int>::append(__return_storage_ptr__,0xd);
    iVar2 = QSurfaceFormat::stencilBufferSize(format);
    QList<int>::append(__return_storage_ptr__,iVar2);
  }
  iVar2 = QSurfaceFormat::samples(format);
  if (1 < iVar2) {
    QList<int>::append(__return_storage_ptr__,100000);
    QList<int>::append(__return_storage_ptr__,1);
    QList<int>::append(__return_storage_ptr__,0x186a1);
    iVar2 = QSurfaceFormat::samples(format);
    QList<int>::append(__return_storage_ptr__,iVar2);
  }
  if ((flags & 1U) != 0) {
    this = QSurfaceFormat::colorSpace(format);
    QColorSpace::QColorSpace(&local_40,SRgb);
    bVar1 = QColorSpace::equals(this,&local_40);
    QColorSpace::~QColorSpace(&local_40);
    if (bVar1) {
      QList<int>::append(__return_storage_ptr__,0x20b2);
      QList<int>::append(__return_storage_ptr__,1);
    }
  }
  QList<int>::append(__return_storage_ptr__,0x8010);
  QList<int>::append(__return_storage_ptr__,drawableBit);
  QList<int>::append(__return_storage_ptr__,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> qglx_buildSpec(const QSurfaceFormat &format, int drawableBit, int flags)
{
    QList<int> spec;

    spec << GLX_LEVEL
         << 0

         << GLX_RENDER_TYPE
         << GLX_RGBA_BIT

         << GLX_RED_SIZE
         << qMax(1, format.redBufferSize())

         << GLX_GREEN_SIZE
         << qMax(1, format.greenBufferSize())

         << GLX_BLUE_SIZE
         << qMax(1, format.blueBufferSize())

         << GLX_ALPHA_SIZE
         << qMax(0, format.alphaBufferSize());

    if (format.swapBehavior() != QSurfaceFormat::SingleBuffer)
        spec << GLX_DOUBLEBUFFER
             << True;

    if (format.stereo())
        spec << GLX_STEREO
             << True;

    if (format.depthBufferSize() != -1)
        spec << GLX_DEPTH_SIZE
             << format.depthBufferSize();

    if (format.stencilBufferSize() != -1)
        spec << GLX_STENCIL_SIZE
             << format.stencilBufferSize();

    if (format.samples() > 1)
        spec << GLX_SAMPLE_BUFFERS_ARB
             << 1
             << GLX_SAMPLES_ARB
             << format.samples();

    if ((flags & QGLX_SUPPORTS_SRGB) && format.colorSpace() == QColorSpace::SRgb)
        spec << GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB
             << True;

    spec << GLX_DRAWABLE_TYPE
         << drawableBit

         << XNone;

    return spec;
}